

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O1

bool __thiscall
embree::TokenStream::tryIdentifier(TokenStream *this,Token *token,ParseLocation *loc)

{
  uint uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  uint *puVar4;
  char cVar5;
  string str;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  string local_98;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  char local_60 [16];
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_48;
  ssize_t local_40;
  ssize_t sStack_38;
  
  local_b0 = 0;
  local_a8[0] = 0;
  local_b8 = local_a8;
  puVar4 = (uint *)Stream<int>::peek((this->cin).ptr);
  if ((ulong)*puVar4 < 0x100) {
    cVar5 = this->isAlphaMap[*puVar4];
  }
  else {
    cVar5 = '\0';
  }
  if (cVar5 != '\0') {
    Stream<int>::get((this->cin).ptr);
    std::__cxx11::string::push_back((char)&local_b8);
    do {
      puVar4 = (uint *)Stream<int>::peek((this->cin).ptr);
      uVar1 = *puVar4;
      if ((ulong)uVar1 < 0x100) {
        if ((9 < uVar1 - 0x30) && (this->isAlphaMap[uVar1] == false)) goto LAB_001d9e86;
      }
      else if (9 < uVar1 - 0x30) goto LAB_001d9e86;
      Stream<int>::get((this->cin).ptr);
      std::__cxx11::string::push_back((char)&local_b8);
    } while( true );
  }
LAB_001d9f30:
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  return (bool)cVar5;
LAB_001d9e86:
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_b8,local_b8 + local_b0);
  Token::Token((Token *)local_78,&local_98,TY_IDENTIFIER,loc);
  token->ty = local_78._0_4_;
  token->field_1 = (anon_union_4_3_4e90a026_for_Token_2)local_78._4_4_;
  std::__cxx11::string::operator=((string *)&token->str,(string *)&local_70);
  _Var3._M_pi = _Stack_48._M_pi;
  peVar2 = local_50;
  local_50 = (element_type *)0x0;
  _Stack_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (token->loc).fileName.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (token->loc).fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar2;
  (token->loc).fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var3._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (token->loc).lineNumber = local_40;
  (token->loc).colNumber = sStack_38;
  if (_Stack_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_48._M_pi);
  }
  if (local_70._M_p != local_60) {
    operator_delete(local_70._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  goto LAB_001d9f30;
}

Assistant:

bool TokenStream::tryIdentifier(Token& token, const ParseLocation& loc)
  {
    std::string str;
    if (!isAlpha(cin->peek())) return false;
    str += (char)cin->get();
    while (isAlphaNum(cin->peek())) str += (char)cin->get();
    token = Token(str,Token::TY_IDENTIFIER,loc);
    return true;
  }